

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::CheckPointer(char *ptr)

{
  markerType *local_40;
  ExternTypeInfo *local_38;
  ExternTypeInfo *type;
  markerType *pmStack_28;
  uint typeId;
  markerType *marker;
  uint *basePtr;
  char *target;
  char *ptr_local;
  
  target = ptr;
  basePtr = (uint *)ReadVmMemoryPointer(ptr);
  if (((uint *)0x10000 < basePtr) &&
     (((basePtr < unmanageableBase || (unmanageableTop < basePtr)) &&
      (marker = (markerType *)NULLC::GetBasePointer(basePtr), marker != (markerType *)0x0)))) {
    pmStack_28 = marker + -1;
    PrintMarker(*pmStack_28);
    if ((*pmStack_28 & 1) == 0) {
      *pmStack_28 = *pmStack_28 | 1;
      type._4_4_ = (uint)(*pmStack_28 >> 8);
      local_38 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           ((FastVector<ExternTypeInfo,_false,_false> *)
                            (NULLC::commonLinker + 0x200),type._4_4_);
      if (local_38->subCat != CAT_NONE) {
        local_40 = marker;
        FastVector<char_*,_false,_false>::push_back(next,(char **)&local_40);
      }
    }
  }
  return;
}

Assistant:

void CheckPointer(char* ptr)
	{
		// We have pointer to stack that has a pointer inside, so 'ptr' is really a pointer to pointer
		char *target = ReadVmMemoryPointer(ptr);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(target > (char*)0x00010000 && (target < unmanageableBase || target > unmanageableTop))
		{
			// Get type that pointer points to
			GC_DEBUG_PRINT("\tGlobal pointer [ref] %p (at %p)\n", target, ptr);

			// Get pointer to the start of memory block. Some pointers may point to the middle of memory blocks
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(target);

			// If there is no base, this pointer points to memory that is not GCs memory
			if(!basePtr)
				return;

			GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

			// Marker is before the block
			markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));
			PrintMarker(*marker);

			// If block is unmarked
			if((*marker & OBJECT_VISIBLE))
				return;

			// Mark block as used
			*marker |= OBJECT_VISIBLE;

			GC_DEBUG_PRINT("\tMarked as used\n");

			unsigned typeId = unsigned(*marker >> 8);
			const ExternTypeInfo &type = NULLC::commonLinker->exTypes[typeId];

			// And if type is not simple, check memory to which pointer points to
			if(type.subCat != ExternTypeInfo::CAT_NONE)
			{
				GC_DEBUG_PRINT("\tPointer %p scheduled on next loop\n", target);

				next->push_back((char*)basePtr);
			}
		}
	}